

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_APICreateParametersSetName(hrgls_APICreateParams params,char *name)

{
  hrgls_Status s;
  char *name_local;
  hrgls_APICreateParams params_local;
  
  if (params == (hrgls_APICreateParams)0x0) {
    params_local._4_4_ = 0x3ee;
  }
  else {
    if (name == (char *)0x0) {
      std::__cxx11::string::operator=((string *)params,"");
    }
    else {
      std::__cxx11::string::operator=((string *)params,name);
    }
    params_local._4_4_ = 0;
  }
  return params_local._4_4_;
}

Assistant:

hrgls_Status hrgls_APICreateParametersSetName(hrgls_APICreateParams params,
    const char *name)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!name) {
      params->name = "";
    } else {
      params->name = name;
    }
    return s;
  }